

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_seeking.c
# Opt level: O1

void shift_cdata(test_state *state,uchar *cbuf_unshifted,int byte_offset,int bit_offset)

{
  aec_stream *paVar1;
  uchar *__s;
  ulong uVar2;
  
  paVar1 = state->strm;
  __s = state->cbuf;
  memset(__s,0,state->buf_len);
  if (paVar1->avail_in != 0) {
    uVar2 = 0;
    do {
      __s[uVar2 + (long)byte_offset] =
           __s[uVar2 + (long)byte_offset] | cbuf_unshifted[uVar2] >> ((byte)bit_offset & 0x1f);
      __s[uVar2 + (long)byte_offset + 1] =
           __s[uVar2 + (long)byte_offset + 1] |
           cbuf_unshifted[uVar2] << (8 - (byte)bit_offset & 0x1f);
      uVar2 = uVar2 + 1;
    } while (uVar2 < paVar1->avail_in);
  }
  return;
}

Assistant:

void shift_cdata(struct test_state *state, unsigned char *cbuf_unshifted,
                 int byte_offset, int bit_offset)
{
    struct aec_stream *strm = state->strm;
    unsigned char *dst = state->cbuf + byte_offset;

    memset(state->cbuf, 0, state->buf_len);
    for (size_t i = 0; i < strm->avail_in; i++) {
        dst[i] |= cbuf_unshifted[i] >> bit_offset;
        dst[i + 1] |= cbuf_unshifted[i] << (8 - bit_offset);
    }
}